

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryCopy
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryCopy *curr)

{
  Name memory;
  Name memory_00;
  undefined1 auVar1 [8];
  bool bVar2;
  int iVar3;
  ExpressionRunner<wasm::ModuleRunner> *pEVar4;
  uint64_t uVar5;
  address64_t aVar6;
  address64_t aVar7;
  address64_t aVar8;
  ExternalInterface *pEVar9;
  ExternalInterface *pEVar10;
  Literal local_220;
  address64_t local_208;
  address64_t local_200;
  Literal local_1f8;
  address64_t local_1e0;
  address64_t local_1d8;
  int64_t i;
  address64_t aStack_1c8;
  int step;
  int64_t end;
  int64_t start;
  Address local_1a0;
  Address sourceMemorySize;
  Address local_180;
  Address destMemorySize;
  undefined1 local_160 [8];
  MemoryInstanceInfo sourceInfo;
  undefined1 local_138 [8];
  MemoryInstanceInfo destInfo;
  Address sizeVal;
  Address sourceVal;
  Address destVal;
  Flow size;
  Flow source;
  undefined1 local_68 [8];
  Flow dest;
  MemoryCopy *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar4,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x10))
  ;
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    goto LAB_00359b2e;
  }
  pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar4,
             *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x18));
  bVar2 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
  }
  else {
    pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&destVal,pEVar4,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20));
    bVar2 = Flow::breaking((Flow *)&destVal);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&destVal);
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      uVar5 = ::wasm::Literal::getUnsigned();
      Address::Address(&sourceVal,uVar5);
      Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
      uVar5 = ::wasm::Literal::getUnsigned();
      Address::Address(&sizeVal,uVar5);
      Flow::getSingleValue((Flow *)&destVal);
      uVar5 = ::wasm::Literal::getUnsigned();
      Address::Address((Address *)&destInfo.name.super_IString.str._M_str,uVar5);
      sourceInfo.name.super_IString.str._M_str =
           *(char **)&((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str;
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_138,this,
                 (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x28))->str);
      destMemorySize.addr =
           (((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str)._M_len;
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_160,this,
                 (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str);
      memory_00.super_IString.str._M_len._4_4_ = destInfo.instance._4_4_;
      memory_00.super_IString.str._M_len._0_4_ = destInfo.instance._0_4_;
      memory_00.super_IString.str._M_str._4_4_ = destInfo.name.super_IString.str._M_len._4_4_;
      memory_00.super_IString.str._M_str._0_4_ = (undefined4)destInfo.name.super_IString.str._M_len;
      local_180 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_138,memory_00);
      memory.super_IString.str._M_len._4_4_ = sourceInfo.instance._4_4_;
      memory.super_IString.str._M_len._0_4_ = sourceInfo.instance._0_4_;
      memory.super_IString.str._M_str._4_4_ = sourceInfo.name.super_IString.str._M_len._4_4_;
      memory.super_IString.str._M_str._0_4_ = (undefined4)sourceInfo.name.super_IString.str._M_len;
      local_1a0 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_160,memory);
      aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
      aVar7 = Address::operator_cast_to_unsigned_long
                        ((Address *)&destInfo.name.super_IString.str._M_str);
      aVar8 = Address::operator_cast_to_unsigned_long(&local_1a0);
      if (aVar8 << 0x10 < aVar6 + aVar7) {
LAB_00359828:
        (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                  (this,"out of bounds segment access in memory.copy");
      }
      else {
        aVar6 = Address::operator_cast_to_unsigned_long(&sourceVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long(&local_180);
        if (aVar8 << 0x10 < aVar6 + aVar7) goto LAB_00359828;
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long(&sizeVal);
        if (aVar6 + aVar7 < aVar8) goto LAB_00359828;
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        if (aVar6 + aVar7 < aVar8) goto LAB_00359828;
        aVar6 = Address::operator_cast_to_unsigned_long(&sourceVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long(&sourceVal);
        if (aVar6 + aVar7 < aVar8) goto LAB_00359828;
        aVar6 = Address::operator_cast_to_unsigned_long(&sourceVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        aVar8 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        if (aVar6 + aVar7 < aVar8) goto LAB_00359828;
      }
      end = 0;
      aStack_1c8 = Address::operator_cast_to_unsigned_long
                             ((Address *)&destInfo.name.super_IString.str._M_str);
      i._4_4_ = 1;
      aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
      aVar7 = Address::operator_cast_to_unsigned_long(&sourceVal);
      if (aVar6 < aVar7) {
        aVar6 = Address::operator_cast_to_unsigned_long
                          ((Address *)&destInfo.name.super_IString.str._M_str);
        end = aVar6 - 1;
        aStack_1c8 = 0xffffffffffffffff;
        i._4_4_ = -1;
      }
      for (local_1d8 = end; local_1d8 != aStack_1c8; local_1d8 = (long)i._4_4_ + local_1d8) {
        pEVar9 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_138);
        auVar1 = local_138;
        aVar6 = Address::operator_cast_to_unsigned_long(&sourceVal);
        wasm::Literal::Literal(&local_1f8,aVar6 + local_1d8);
        local_200 = local_180.addr;
        local_1e0 = (address64_t)
                    getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)auVar1,&local_1f8,1,local_180
                              );
        pEVar10 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_160);
        auVar1 = local_160;
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        wasm::Literal::Literal(&local_220,aVar6 + local_1d8);
        local_208 = (address64_t)
                    getFinalAddressWithoutOffset
                              ((ModuleRunnerBase<wasm::ModuleRunner> *)auVar1,&local_220,1,local_1a0
                              );
        iVar3 = (*pEVar10->_vptr_ExternalInterface[0xd])
                          (pEVar10,local_208,
                           CONCAT44(sourceInfo.instance._4_4_,sourceInfo.instance._0_4_),
                           CONCAT44(sourceInfo.name.super_IString.str._M_len._4_4_,
                                    (undefined4)sourceInfo.name.super_IString.str._M_len));
        (*pEVar9->_vptr_ExternalInterface[0x16])
                  (pEVar9,local_1e0,(ulong)(uint)(int)(char)iVar3,
                   CONCAT44(destInfo.instance._4_4_,destInfo.instance._0_4_),
                   CONCAT44(destInfo.name.super_IString.str._M_len._4_4_,
                            (undefined4)destInfo.name.super_IString.str._M_len));
        ::wasm::Literal::~Literal(&local_220);
        ::wasm::Literal::~Literal(&local_1f8);
      }
      Flow::Flow(__return_storage_ptr__);
    }
    Flow::~Flow((Flow *)&destVal);
  }
  Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
LAB_00359b2e:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryCopy(MemoryCopy* curr) {
    NOTE_ENTER("MemoryCopy");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow source = self()->visit(curr->source);
    if (source.breaking()) {
      return source;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(source);
    NOTE_EVAL1(size);
    Address destVal(dest.getSingleValue().getUnsigned());
    Address sourceVal(source.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    auto destInfo = getMemoryInstanceInfo(curr->destMemory);
    auto sourceInfo = getMemoryInstanceInfo(curr->sourceMemory);
    auto destMemorySize = destInfo.instance->getMemorySize(destInfo.name);
    auto sourceMemorySize = sourceInfo.instance->getMemorySize(sourceInfo.name);
    if (sourceVal + sizeVal > sourceMemorySize * Memory::kPageSize ||
        destVal + sizeVal > destMemorySize * Memory::kPageSize ||
        // FIXME: better/cheaper way to detect wrapping?
        sourceVal + sizeVal < sourceVal || sourceVal + sizeVal < sizeVal ||
        destVal + sizeVal < destVal || destVal + sizeVal < sizeVal) {
      trap("out of bounds segment access in memory.copy");
    }

    int64_t start = 0;
    int64_t end = sizeVal;
    int step = 1;
    // Reverse direction if source is below dest
    if (sourceVal < destVal) {
      start = int64_t(sizeVal) - 1;
      end = -1;
      step = -1;
    }
    for (int64_t i = start; i != end; i += step) {
      destInfo.interface()->store8(
        destInfo.instance->getFinalAddressWithoutOffset(
          Literal(destVal + i), 1, destMemorySize),
        sourceInfo.interface()->load8s(
          sourceInfo.instance->getFinalAddressWithoutOffset(
            Literal(sourceVal + i), 1, sourceMemorySize),
          sourceInfo.name),
        destInfo.name);
    }
    return {};
  }